

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout_p.h
# Opt level: O2

void __thiscall
QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>::adjustCursor
          (QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *this,QPoint *pos)

{
  int **this_00;
  compare_eq_result_container<QList<int>,_int> cVar1;
  bool bVar2;
  QWidget *this_01;
  long in_FS_OFFSET;
  undefined1 local_58 [16];
  QArrayDataPointer<int> local_48;
  QCursor local_30;
  
  local_30.d = *(QCursorData **)(in_FS_OFFSET + 0x28);
  this_01 = QLayout::parentWidget((QLayout *)&this[-1].movingSeparator.d.size);
  this->hoverPos = *pos;
  if ((pos->yp).m_i == 0 && (pos->xp).m_i == 0) {
    if ((this->hoverSeparator).d.size != 0) {
      local_48._0_16_ =
           QDockAreaLayoutInfo::separatorRect
                     ((QDockAreaLayoutInfo *)&this[1].hoverSeparator.d.ptr,&this->hoverSeparator);
      QWidget::update(this_01,(QRect *)&local_48);
    }
    QList<int>::clear(&this->hoverSeparator);
    if (this->cursorAdjusted == true) {
      this->cursorAdjusted = false;
      if (this->hasOldCursor == true) {
        QWidget::setCursor(this_01,&this->oldCursor);
      }
      else {
        QWidget::unsetCursor(this_01);
      }
    }
  }
  else if ((this->movingSeparator).d.size == 0) {
    this_00 = &this[1].hoverSeparator.d.ptr;
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QDockAreaLayoutInfo::findSeparator((QList<int> *)&local_48,(QDockAreaLayoutInfo *)this_00,pos);
    cVar1 = QList<int>::operator!=((QList<int> *)&local_48,&this->hoverSeparator);
    if (cVar1) {
      if ((this->hoverSeparator).d.size != 0) {
        local_58 = (undefined1  [16])
                   QDockAreaLayoutInfo::separatorRect
                             ((QDockAreaLayoutInfo *)this_00,&this->hoverSeparator);
        QWidget::update(this_01,(QRect *)local_58);
      }
      QArrayDataPointer<int>::operator=((QArrayDataPointer<int> *)this,&local_48);
      if ((this->hoverSeparator).d.size == 0) {
        if (this->cursorAdjusted == true) {
          this->cursorAdjusted = false;
          if (this->hasOldCursor == true) {
            QWidget::setCursor(this_01,&this->oldCursor);
          }
          else {
            QWidget::unsetCursor(this_01);
          }
        }
      }
      else {
        local_58 = (undefined1  [16])
                   QDockAreaLayoutInfo::separatorRect
                             ((QDockAreaLayoutInfo *)this_00,&this->hoverSeparator);
        QWidget::update(this_01,(QRect *)local_58);
        if (this->cursorAdjusted == false) {
          QWidget::cursor((QWidget *)local_58);
          QCursor::operator=(&this->oldCursor,(QCursor *)local_58);
          QCursor::~QCursor((QCursor *)local_58);
          bVar2 = QWidget::testAttribute_helper(this_01,WA_SetCursor);
          this->hasOldCursor = bVar2;
        }
        separatorCursor((QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout> *)local_58,
                        &this->hoverSeparator);
        QCursor::operator=(&this->adjustedCursor,(QCursor *)local_58);
        QCursor::~QCursor((QCursor *)local_58);
        QWidget::setCursor(this_01,&this->adjustedCursor);
        this->cursorAdjusted = true;
      }
    }
    QArrayDataPointer<int>::~QArrayDataPointer(&local_48);
  }
  if (*(QCursorData **)(in_FS_OFFSET + 0x28) == local_30.d) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayoutSeparatorHelper<Layout>::adjustCursor(const QPoint &pos)
{
    QWidget *w = layout()->window();
    hoverPos = pos;

    if (pos == QPoint(0, 0)) {
        if (!hoverSeparator.isEmpty())
            w->update(layout()->dockAreaLayoutInfo()->separatorRect(hoverSeparator));
        hoverSeparator.clear();

        if (cursorAdjusted) {
            cursorAdjusted = false;
            if (hasOldCursor)
                w->setCursor(oldCursor);
            else
                w->unsetCursor();
        }
    } else if (movingSeparator.isEmpty()) { // Don't change cursor when moving separator
        QList<int> pathToSeparator = findSeparator(pos);

        if (pathToSeparator != hoverSeparator) {
            if (!hoverSeparator.isEmpty())
                w->update(layout()->dockAreaLayoutInfo()->separatorRect(hoverSeparator));

            hoverSeparator = pathToSeparator;

            if (hoverSeparator.isEmpty()) {
                if (cursorAdjusted) {
                    cursorAdjusted = false;
                    if (hasOldCursor)
                        w->setCursor(oldCursor);
                    else
                        w->unsetCursor();
                }
            } else {
                w->update(layout()->dockAreaLayoutInfo()->separatorRect(hoverSeparator));
                if (!cursorAdjusted) {
                    oldCursor = w->cursor();
                    hasOldCursor = w->testAttribute(Qt::WA_SetCursor);
                }
                adjustedCursor = separatorCursor(hoverSeparator);
                w->setCursor(adjustedCursor);
                cursorAdjusted = true;
            }
        }
    }
}